

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_suite.cpp
# Opt level: O0

void wostringstream_suite::test_single(void)

{
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> **this;
  bool v;
  size_t __n;
  void *__buf;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1c8;
  char *msg;
  undefined1 local_190 [8];
  ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
  container;
  wostringstream output;
  
  this = &container.
          super_basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>
          .content;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)this);
  ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
  ::ostream_buffer((ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
                    *)local_190,(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)this);
  msg._2_1_ = ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
              ::grow((ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
                      *)local_190,1);
  msg._1_1_ = 1;
  __n = 0x6e;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("container.grow(1)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x6e,"void wostringstream_suite::test_single()",(long)&msg + 2,(long)&msg + 1);
  ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
  ::write((ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
           *)local_190,0x41,__buf,__n);
  std::__cxx11::wostringstream::str();
  v = std::operator==(&local_1c8,L"A");
  boost::detail::test_impl
            ("output.str() == L\"A\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x70,"void wostringstream_suite::test_single()",v);
  std::__cxx11::wstring::~wstring((wstring *)&local_1c8);
  ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
  ::~ostream_buffer((ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
                     *)local_190);
  std::__cxx11::wostringstream::~wostringstream
            ((wostringstream *)
             &container.
              super_basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>
              .content);
  return;
}

Assistant:

void test_single()
{
    std::wostringstream output;
    ostream_buffer<wchar_t> container(output);
    TRIAL_PROTOCOL_TEST_EQUAL(container.grow(1), true);
    TRIAL_PROTOCOL_TEST_NO_THROW(container.write(L'A'));
    TRIAL_PROTOCOL_TEST(output.str() == L"A");
}